

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tasn_dec.cc
# Opt level: O0

int asn1_check_tlen(long *olen,int *otag,uchar *oclass,char *cst,uchar **in,long len,int exptag,
                   int expclass,char opt)

{
  uchar *local_60;
  uchar *p;
  long plen;
  int local_48;
  int pclass;
  int ptag;
  int i;
  long len_local;
  uchar **in_local;
  char *cst_local;
  uchar *oclass_local;
  int *otag_local;
  long *olen_local;
  
  local_60 = *in;
  _ptag = len;
  len_local = (long)in;
  in_local = (uchar **)cst;
  cst_local = (char *)oclass;
  oclass_local = (uchar *)otag;
  otag_local = (int *)olen;
  pclass = ASN1_get_object(&local_60,(long *)&p,&local_48,(int *)((long)&plen + 4),len);
  if ((pclass & 0x80U) == 0) {
    if ((exptag < 0) || ((exptag == local_48 && (expclass == plen._4_4_)))) {
      if (in_local != (uchar **)0x0) {
        *(byte *)in_local = (byte)pclass & 0x20;
      }
      if (otag_local != (int *)0x0) {
        *(uchar **)otag_local = p;
      }
      if (cst_local != (char *)0x0) {
        *cst_local = (char)plen._4_4_;
      }
      if (oclass_local != (uchar *)0x0) {
        *(int *)oclass_local = local_48;
      }
      *(uchar **)len_local = local_60;
      olen_local._4_4_ = 1;
    }
    else if (opt == '\0') {
      ERR_put_error(0xc,0,0xbe,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_dec.cc"
                    ,0x3ac);
      olen_local._4_4_ = 0;
    }
    else {
      olen_local._4_4_ = -1;
    }
  }
  else {
    ERR_put_error(0xc,0,0x67,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_dec.cc"
                  ,0x3a3);
    olen_local._4_4_ = 0;
  }
  return olen_local._4_4_;
}

Assistant:

static int asn1_check_tlen(long *olen, int *otag, unsigned char *oclass,
                           char *cst, const unsigned char **in, long len,
                           int exptag, int expclass, char opt) {
  int i;
  int ptag, pclass;
  long plen;
  const unsigned char *p;
  p = *in;

  i = ASN1_get_object(&p, &plen, &ptag, &pclass, len);
  if (i & 0x80) {
    OPENSSL_PUT_ERROR(ASN1, ASN1_R_BAD_OBJECT_HEADER);
    return 0;
  }
  if (exptag >= 0) {
    if ((exptag != ptag) || (expclass != pclass)) {
      // If type is OPTIONAL, not an error: indicate missing type.
      if (opt) {
        return -1;
      }
      OPENSSL_PUT_ERROR(ASN1, ASN1_R_WRONG_TAG);
      return 0;
    }
  }

  if (cst) {
    *cst = i & V_ASN1_CONSTRUCTED;
  }

  if (olen) {
    *olen = plen;
  }

  if (oclass) {
    *oclass = pclass;
  }

  if (otag) {
    *otag = ptag;
  }

  *in = p;
  return 1;
}